

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> * __thiscall
pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
          (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this,
          vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *other)

{
  bool bVar1;
  size_t sVar2;
  uchar *p;
  reference args;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RSI;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_RDI;
  size_t i;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *in_stack_ffffffffffffffd0
  ;
  polymorphic_allocator<unsigned_char> *in_stack_ffffffffffffffe0;
  ulong uVar3;
  ulong index;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_00;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    this_00 = in_RDI;
    bVar1 = pmr::operator==(in_stack_ffffffffffffffe0,&in_RDI->alloc);
    if (bVar1) {
      swap<unsigned_char*>(&in_RDI->ptr,&in_RSI->ptr);
      swap<unsigned_long>(&in_RDI->nAlloc,&in_RSI->nAlloc);
      swap<unsigned_long>(&in_RDI->nStored,&in_RSI->nStored);
      local_8 = in_RDI;
    }
    else {
      clear(in_stack_ffffffffffffffd0);
      size(in_RSI);
      reserve(this_00,(size_t)in_RSI);
      uVar3 = 0;
      while (index = uVar3, sVar2 = size(in_RSI), uVar3 < sVar2) {
        p = in_RDI->ptr + index;
        args = operator[](in_RSI,index);
        pmr::polymorphic_allocator<unsigned_char>::construct<unsigned_char,unsigned_char>
                  (&in_RDI->alloc,p,args);
        uVar3 = index + 1;
      }
      sVar2 = size(in_RSI);
      in_RDI->nStored = sVar2;
      local_8 = in_RDI;
    }
  }
  return local_8;
}

Assistant:

vector &operator=(vector &&other) {
        if (this == &other)
            return *this;

        if (alloc == other.alloc) {
            pstd::swap(ptr, other.ptr);
            pstd::swap(nAlloc, other.nAlloc);
            pstd::swap(nStored, other.nStored);
        } else {
            clear();
            reserve(other.size());
            for (size_t i = 0; i < other.size(); ++i)
                alloc.template construct<T>(ptr + i, std::move(other[i]));
            nStored = other.size();
        }

        return *this;
    }